

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

bool __thiscall
CBlockPolicyEstimator::_removeTx(CBlockPolicyEstimator *this,uint256 *hash,bool inBlock)

{
  bool bVar1;
  pointer __x;
  pointer ppVar2;
  long in_RDI;
  long in_FS_OFFSET;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  TxConfirmStats *in_stack_00000008;
  iterator pos;
  uint in_stack_0000007c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar4;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (AnnotatedMixin<std::mutex> *)0x122b75e);
  std::
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  ::find(in_stack_ffffffffffffff90,
         (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  ::end(in_stack_ffffffffffffff90);
  bVar1 = std::operator==((_Self *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (_Self *)in_stack_ffffffffffffff90);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    __x = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
             operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>
                         *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar3 = (ppVar2->second).blockHeight;
    uVar4 = *(undefined4 *)(in_RDI + 0x58);
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    TxConfirmStats::removeTx
              (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_0000007c,
               SUB81((ulong)lVar5 >> 0x38,0));
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    TxConfirmStats::removeTx
              (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_0000007c,
               SUB81((ulong)lVar5 >> 0x38,0));
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    TxConfirmStats::removeTx
              (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_0000007c,
               SUB81((ulong)lVar5 >> 0x38,0));
    std::
    map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
    ::erase((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
             *)CONCAT44(uVar4,uVar3),(key_type *)__x);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CBlockPolicyEstimator::_removeTx(const uint256& hash, bool inBlock)
{
    AssertLockHeld(m_cs_fee_estimator);
    std::map<uint256, TxStatsInfo>::iterator pos = mapMemPoolTxs.find(hash);
    if (pos != mapMemPoolTxs.end()) {
        feeStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        shortStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        longStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        mapMemPoolTxs.erase(hash);
        return true;
    } else {
        return false;
    }
}